

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH32_hash_t XXH32(void *input,size_t len,XXH32_hash_t seed)

{
  xxh_u32 xVar1;
  int *in_RCX;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (len < 0x10) {
    iVar5 = seed + 0x165667b1;
  }
  else {
    lVar2 = (long)input + len;
    if (input == (void *)0x0) {
      lVar2 = 0;
    }
    in_RCX = (int *)(lVar2 + -0xf);
    iVar5 = seed + 0x24234428;
    uVar4 = seed + 0x85ebca77;
    uVar3 = seed + 0x61c8864f;
    do {
      uVar6 = *input * -0x7a143589 + iVar5;
      uVar7 = uVar6 * 0x2000 | uVar6 >> 0x13;
      uVar4 = *(int *)((long)input + 4) * -0x7a143589 + uVar4;
      uVar9 = uVar4 * 0x2000 | uVar4 >> 0x13;
      iVar5 = uVar7 * -0x61c8864f;
      uVar4 = *(int *)((long)input + 8) * -0x7a143589 + seed;
      uVar8 = uVar4 * 0x2000 | uVar4 >> 0x13;
      uVar4 = uVar9 * -0x61c8864f;
      uVar3 = *(int *)((long)input + 0xc) * -0x7a143589 + uVar3;
      uVar6 = uVar3 * 0x2000 | uVar3 >> 0x13;
      seed = uVar8 * -0x61c8864f;
      uVar3 = uVar6 * -0x61c8864f;
      input = (void *)((long)input + 0x10);
    } while (input < in_RCX);
    iVar5 = (uVar6 * -0x193c0000 | uVar3 >> 0xe) + (uVar8 * 0x779b1000 | seed >> 0x14) +
            (uVar9 * 0x1bbcd880 | uVar4 >> 0x19) + (uVar7 * 0x3c6ef362 | (uint)(iVar5 < 0));
  }
  xVar1 = XXH32_finalize(iVar5 + (uint)len,(xxh_u8 *)input,(ulong)((uint)len & 0xf),
                         (XXH_alignment)in_RCX);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32 (const void* input, size_t len, XXH32_hash_t seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH32_state_t state;
    XXH32_reset(&state, seed);
    XXH32_update(&state, (const xxh_u8*)input, len);
    return XXH32_digest(&state);
#else
    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 3) == 0) {   /* Input is 4-bytes aligned, leverage the speed benefit */
            return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }   }

    return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);
#endif
}